

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

QErrorMessage * QErrorMessage::qtHandler(void)

{
  long lVar1;
  QErrorMessage *pQVar2;
  long in_FS_OFFSET;
  QWidget *in_stack_000000c8;
  QErrorMessage *in_stack_000000d0;
  QString *in_stack_ffffffffffffffe8;
  QWidget *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (qtMessageHandler == (QErrorMessage *)0x0) {
    pQVar2 = (QErrorMessage *)operator_new(0x28);
    QErrorMessage(in_stack_000000d0,in_stack_000000c8);
    qtMessageHandler = pQVar2;
    qAddPostRoutine(deleteStaticcQErrorMessage);
    QCoreApplication::applicationName();
    QWidget::setWindowTitle(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    QString::~QString((QString *)0x748ad2);
    originalMessageHandler = (QtMessageHandler)qInstallMessageHandler(jump);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qtMessageHandler;
  }
  __stack_chk_fail();
}

Assistant:

QErrorMessage * QErrorMessage::qtHandler()
{
    if (!qtMessageHandler) {
        qtMessageHandler = new QErrorMessage(nullptr);
        qAddPostRoutine(deleteStaticcQErrorMessage); // clean up
        qtMessageHandler->setWindowTitle(QCoreApplication::applicationName());
        originalMessageHandler = qInstallMessageHandler(jump);
    }
    return qtMessageHandler;
}